

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  curl_blob *pcVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  _Bool _Var8;
  curl_blob *pcVar9;
  char *pcVar10;
  
  lVar4 = source->version_max;
  dest->version = source->version;
  dest->version_max = lVar4;
  bVar5 = source->field_0x68 & 1;
  bVar1 = dest->field_0x68;
  dest->field_0x68 = bVar1 & 0xfe | bVar5;
  bVar6 = source->field_0x68 & 2;
  dest->field_0x68 = bVar1 & 0xfc | bVar5 | bVar6;
  bVar7 = source->field_0x68 & 4;
  dest->field_0x68 = bVar1 & 0xf8 | bVar5 | bVar6 | bVar7;
  dest->field_0x68 = bVar1 & 0xf0 | bVar5 | bVar6 | bVar7 | source->field_0x68 & 8;
  pcVar2 = source->cert_blob;
  if (pcVar2 == (curl_blob *)0x0) {
LAB_00154812:
    pcVar2 = source->ca_info_blob;
    if (pcVar2 != (curl_blob *)0x0) {
      pcVar9 = (curl_blob *)(*Curl_cmalloc)(pcVar2->len + 0x18);
      if (pcVar9 == (curl_blob *)0x0) goto LAB_001549b2;
      sVar3 = pcVar2->len;
      pcVar9->len = sVar3;
      pcVar9->flags = 1;
      pcVar9->data = pcVar9 + 1;
      memcpy(pcVar9 + 1,pcVar2->data,sVar3);
      dest->ca_info_blob = pcVar9;
    }
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->pinned_key == (char *)0x0) {
      dest->pinned_key = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->pinned_key);
      dest->pinned_key = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    if (source->curves == (char *)0x0) {
      dest->curves = (char *)0x0;
    }
    else {
      pcVar10 = (*Curl_cstrdup)(source->curves);
      dest->curves = pcVar10;
      if (pcVar10 == (char *)0x0) goto LAB_001549b2;
    }
    _Var8 = true;
  }
  else {
    pcVar9 = (curl_blob *)(*Curl_cmalloc)(pcVar2->len + 0x18);
    if (pcVar9 != (curl_blob *)0x0) {
      sVar3 = pcVar2->len;
      pcVar9->len = sVar3;
      pcVar9->flags = 1;
      pcVar9->data = pcVar9 + 1;
      memcpy(pcVar9 + 1,pcVar2->data,sVar3);
      dest->cert_blob = pcVar9;
      goto LAB_00154812;
    }
LAB_001549b2:
    _Var8 = false;
  }
  return _Var8;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_BLOB(cert_blob);
  CLONE_BLOB(ca_info_blob);
  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);
  CLONE_STRING(curves);

  return TRUE;
}